

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  TValue *io1;
  TValue *pTVar1;
  TValue *io2;
  ulong uVar2;
  TValue k;
  Value local_30;
  undefined1 local_28;
  
  if (((int)key == 0) || ((ulong)t->asize <= key - 1U)) {
    pTVar1 = getintfromhash(t,key);
    if (pTVar1->tt_ == ' ') {
      local_28 = 3;
      local_30.i = key;
      luaH_newkey(L,t,(TValue *)&local_30,value);
    }
    else {
      pTVar1->value_ = value->value_;
      pTVar1->tt_ = value->tt_;
    }
  }
  else {
    uVar2 = (ulong)((int)key - 1);
    *(lu_byte *)((long)t->array + uVar2 + 4) = value->tt_;
    t->array[-1 - uVar2] = value->value_;
  }
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  unsigned ik = ikeyinarray(t, key);
  if (ik > 0)
    obj2arr(t, ik - 1, value);
  else {
    int ok = rawfinishnodeset(getintfromhash(t, key), value);
    if (!ok) {
      TValue k;
      setivalue(&k, key);
      luaH_newkey(L, t, &k, value);
    }
  }
}